

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<unsigned_short,short>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int iVar2;
  short u;
  int local_3c;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_32;
  
  u = 0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>
            (&local_32,&u);
  su.m_int = u;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>
            (&st2,&su);
  local_32.m_int = 0;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &local_32,&u);
  if (-1 < su.m_int) {
    local_32.m_int = st2.m_int;
    SafeInt::operator_cast_to_short((SafeInt *)&local_32);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              (&local_32,st2);
    operator*(u,local_32);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,su);
    u = 1;
    iVar2 = 1;
    local_3c = iVar2;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,&local_3c);
    local_3c = iVar2;
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_3c)
    ;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    local_3c = iVar2;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_3c);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              (&local_32,st2);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,su);
    u = 1;
    local_3c = iVar2;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_3c);
    local_3c = iVar2;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,&local_3c);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              (&local_32,st2);
    operator/(u,local_32);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,su);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              (&local_32,st2);
    operator+(u,local_32);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,su);
    local_3c = 0;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,&local_3c);
    u = 0;
    local_3c = 0;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_3c);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              (&local_32,st2);
    operator-(u,local_32);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    local_3c = iVar2;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,&local_3c);
    local_3c = iVar2;
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_3c)
    ;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,su);
    u = 1;
    local_3c = iVar2;
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_3c)
    ;
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SVar1 = SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)&local_32,su);
    operator<<(SVar1.m_int,su);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,su);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SVar1 = SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)&local_32,su);
    operator>>(SVar1.m_int,su);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,u);
    SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_32,su);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
              (&local_32,st2);
    local_3c._0_2_ = local_32.m_int & u & su.m_int;
    SafeInt::operator_cast_to_unsigned_short((SafeInt *)&local_3c);
    local_32.m_int = su.m_int & u & local_32.m_int & st2.m_int;
    local_3c._0_2_ = su.m_int | u;
    SafeInt::operator_cast_to_unsigned_short((SafeInt *)&local_3c);
    local_32.m_int = su.m_int | u | local_32.m_int | st2.m_int;
    local_3c = CONCAT22(local_3c._2_2_,su.m_int ^ u ^ local_32.m_int);
    SafeInt::operator_cast_to_unsigned_short((SafeInt *)&local_3c);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}